

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O3

void amrex::FillSignedDistance
               (MultiFab *mf,Level *ls_lev,EBFArrayBoxFactory *eb_factory,int refratio,
               bool fluid_has_positive_sign)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  int iVar6;
  undefined8 uVar7;
  pointer piVar8;
  bool bVar9;
  int ifac;
  undefined4 extraout_EAX;
  int iVar10;
  Box *pBVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int j_shift;
  uint uVar18;
  uint uVar19;
  int i_shift;
  int iVar20;
  int iVar21;
  int iVar22;
  size_type sVar23;
  long lVar24;
  int iVar26;
  pointer piVar27;
  int i_1;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  double dVar35;
  double dVar40;
  undefined1 auVar39 [16];
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double *pdVar44;
  int iVar46;
  undefined1 auVar45 [16];
  int iVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  double dVar63;
  Periodicity PVar64;
  Box eb_search;
  IntVect ind_facets;
  DeviceVector<GpuArray<Real,_3_*_2>_> facets;
  DeviceVector<int> cutcell_offset;
  DeviceVector<int> is_cut;
  RealVect c_vec_tmp;
  RealVect facet_p0;
  RealVect facet_normal;
  RealVect edge_v;
  RealVect edge_p0;
  MFIter mfi;
  double local_788;
  uint uStack_704;
  Box local_6c8;
  undefined8 local_6a8;
  double dStack_6a0;
  double local_698;
  undefined8 uStack_690;
  MultiCutFab *local_680;
  long local_678;
  long local_670;
  double *local_668;
  long local_660;
  ulong local_658;
  double *local_650;
  double *local_648;
  long local_640;
  double *local_638;
  double local_630;
  double local_628;
  uint local_620;
  int local_61c;
  int local_618;
  Box local_614;
  undefined4 local_5f8;
  uint uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  double dStack_5d0;
  double local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  double *pdStack_5b0;
  double local_5a8;
  undefined8 uStack_5a0;
  double local_598;
  undefined8 uStack_590;
  double local_588;
  double dStack_580;
  FabArray<amrex::EBCellFlagFab> *local_570;
  Real local_568;
  uint local_560 [4];
  double local_550;
  int local_548;
  int local_544 [3];
  double local_538;
  undefined8 uStack_530;
  undefined1 local_528 [16];
  size_type local_518;
  undefined1 local_508 [16];
  size_type local_4f8;
  PODVector<int,_std::allocator<int>_> local_4e8;
  int local_4c8;
  uint uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  double local_4b8;
  undefined4 uStack_4b0;
  uint uStack_4ac;
  undefined1 local_4a8 [16];
  double local_498;
  double dStack_490;
  Real local_488;
  Real RStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double *local_458;
  undefined8 uStack_450;
  double local_448;
  double dStack_440;
  undefined1 local_438 [16];
  double local_428 [4];
  double local_408 [4];
  double local_3e8 [4];
  double local_3c8 [4];
  Level *local_3a8;
  long local_3a0;
  Array4<double> local_398;
  MultiCutFab *local_358;
  MultiCutFab *local_350;
  MultiCutFab *local_348;
  double local_340 [4];
  undefined8 uStack_320;
  undefined1 local_318 [16];
  double local_308;
  double dStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  Real local_2d8;
  Real RStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8 [4];
  double local_288 [4];
  Array4<const_double> local_268;
  MFIter local_228;
  Periodicity local_1c8;
  undefined4 uStack_1bc;
  double local_1b8;
  Real local_1b0;
  Real RStack_1a8;
  Real local_1a0;
  uint local_198;
  pointer local_190;
  double local_188;
  double local_180;
  double *local_178;
  double *pdStack_170;
  long local_168;
  Long LStack_160;
  ulong local_138;
  Array4<const_double> local_130;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_amrex::EBCellFlag> local_70;
  MultiCutFab *pMVar25;
  
  local_61c = refratio;
  bVar9 = FabArrayBase::is_nodal((FabArrayBase *)mf);
  if (!bVar9) {
    Assert_host("mf.is_nodal()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB_utils.cpp"
                ,0x1d6,(char *)0x0);
  }
  EB2::Level::fillLevelSet(ls_lev,mf,&ls_lev->m_geom);
  local_680 = EBDataCollection::getBndryCent
                        ((eb_factory->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  EBDataCollection::getAreaFrac
            ((eb_factory->m_ebdc).
             super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_570 = EBDataCollection::getMultiEBCellFlagFab
                        ((eb_factory->m_ebdc).
                         super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (fluid_has_positive_sign) {
    uVar34 = 0x3ff0000000000000;
  }
  else {
    uVar34 = 0xbff0000000000000;
  }
  uStack_704 = (uint)(uVar34 >> 0x20);
  local_588 = (eb_factory->m_geom).super_CoordSys.dx[0];
  dStack_580 = (eb_factory->m_geom).super_CoordSys.dx[1];
  iVar12 = (local_570->super_FabArrayBase).n_grow.vect[0];
  local_5a8 = (eb_factory->m_geom).super_CoordSys.dx[2];
  uStack_5a0 = 0;
  iVar46 = (local_680->m_data).super_FabArrayBase.n_grow.vect[0];
  local_488 = (ls_lev->m_geom).super_CoordSys.dx[0];
  RStack_480 = (ls_lev->m_geom).super_CoordSys.dx[1];
  local_568 = (ls_lev->m_geom).super_CoordSys.dx[2];
  local_3a8 = ls_lev;
  MFIter::MFIter(&local_228,(FabArrayBase *)mf,'\0');
  if (local_228.currentIndex < local_228.endIndex) {
    auVar4._8_8_ = dStack_580;
    auVar4._0_8_ = local_588;
    dVar49 = dStack_580;
    if (local_588 <= dStack_580) {
      dVar49 = local_588;
    }
    local_448 = dStack_580;
    dStack_440 = dStack_580;
    dVar51 = dStack_580;
    if (dStack_580 <= local_588) {
      dVar51 = local_588;
    }
    dVar48 = local_5a8;
    if (dVar49 <= local_5a8) {
      dVar48 = dVar49;
    }
    dVar48 = (double)(iVar12 + 1) * dVar48;
    local_340[3] = local_5a8;
    if (local_5a8 <= dVar51) {
      local_340[3] = dVar51;
    }
    uStack_5f4 = uStack_704 ^ 0x80000000;
    uStack_5ec = 0x80000000;
    local_5f8 = 0;
    uStack_5f0 = 0;
    local_438 = divpd(_DAT_00753000,auVar4);
    local_628 = 1.0 / local_5a8;
    uStack_320 = uStack_5a0;
    local_2c8 = local_340[3] + dVar48;
    uStack_2c0 = uStack_5a0;
    local_2f8 = CONCAT44(iVar46,iVar46);
    uStack_2f0 = 0;
    local_2d8 = RStack_480;
    RStack_2d0 = RStack_480;
    local_2b8 = local_438._8_8_;
    local_308 = local_5a8;
    dStack_300 = local_5a8;
    local_318._8_8_ = local_588;
    local_318._0_8_ = local_588;
    local_2e8 = iVar46;
    iStack_2e4 = iVar46;
    iStack_2e0 = iVar46;
    iStack_2dc = iVar46;
    dStack_2b0 = local_2b8;
    do {
      FabArrayBase::fabbox
                (&local_614,local_228.fabArray,
                 ((local_228.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_228.currentIndex]);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_398,&mf->super_FabArray<amrex::FArrayBox>,&local_228);
      bVar9 = MultiCutFab::ok(local_680,&local_228);
      auVar39 = _DAT_0074fb40;
      auVar4 = _DAT_0074fb30;
      if (bVar9) {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_70,local_570,&local_228);
        BATransformer::operator()
                  (&local_6c8,&((local_228.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_228.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_228.currentIndex] * 0x1c +
                          *(long *)&((((local_228.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        pBVar11 = Box::coarsen(&local_6c8,local_61c);
        lVar13 = 0;
        do {
          if (((pBVar11->btype).itype >> ((uint)lVar13 & 0x1f) & 1) != 0) {
            piVar1 = (pBVar11->bigend).vect + lVar13;
            *piVar1 = *piVar1 + -1;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        (pBVar11->btype).itype = 0;
        iVar12 = (pBVar11->smallend).vect[1];
        iVar46 = (pBVar11->smallend).vect[2];
        iVar47 = (pBVar11->bigend).vect[0];
        (pBVar11->smallend).vect[0] = (pBVar11->smallend).vect[0] - local_2e8;
        (pBVar11->smallend).vect[1] = iVar12 - iStack_2e4;
        (pBVar11->smallend).vect[2] = iVar46 - iStack_2e0;
        (pBVar11->bigend).vect[0] = iVar47 + iStack_2dc;
        uVar57 = *(undefined8 *)((pBVar11->bigend).vect + 1);
        *(ulong *)((pBVar11->bigend).vect + 1) =
             CONCAT44((int)((ulong)uVar57 >> 0x20) + local_2f8._4_4_,(int)uVar57 + (int)local_2f8);
        uVar29 = ((local_6c8.bigend.vect[2] - local_6c8.smallend.vect[2]) + 1) *
                 ((local_6c8.bigend.vect[0] - local_6c8.smallend.vect[0]) + 1) *
                 ((local_6c8.bigend.vect[1] - local_6c8.smallend.vect[1]) + 1);
        uVar32 = (ulong)(int)uVar29;
        local_4e8.m_data = (pointer)0x0;
        local_4e8.m_size = 0;
        local_4e8.m_capacity = 0;
        uVar31 = 0x10;
        sVar23 = 0x10;
        if (0x10 < uVar32) {
          do {
            sVar23 = sVar23 * 3 + 1 >> 1;
          } while (sVar23 < uVar32);
        }
        PODVector<int,_std::allocator<int>_>::AllocateBuffer(&local_4e8,sVar23);
        piVar8 = local_4e8.m_data;
        local_508 = (undefined1  [16])0x0;
        local_4f8 = 0;
        if (0x10 < uVar32) {
          uVar31 = 0x10;
          do {
            uVar31 = uVar31 * 3 + 1 >> 1;
          } while (uVar31 < uVar32);
        }
        local_4e8.m_size = uVar32;
        PODVector<int,_std::allocator<int>_>::AllocateBuffer
                  ((PODVector<int,_std::allocator<int>_> *)local_508,uVar31);
        uVar57 = local_508._0_8_;
        local_508._8_8_ = uVar32;
        piVar27 = (pointer)local_508._0_8_;
        if ((int)uVar29 < 1) {
LAB_005e959a:
          if (piVar27 != (pointer)0x0) goto LAB_005e959f;
        }
        else {
          lVar13 = ((long)local_6c8.bigend.vect[0] - (long)local_6c8.smallend.vect[0]) + 1;
          lVar33 = (long)(((local_6c8.bigend.vect[1] - local_6c8.smallend.vect[1]) + 1) *
                         (int)lVar13);
          uVar31 = 0;
          uVar18 = 0;
          do {
            lVar15 = (long)uVar31 % lVar33;
            uVar19 = (uint)((local_70.p
                             [((int)(lVar15 / lVar13) +
                              (local_6c8.smallend.vect[1] - local_70.begin.y)) * local_70.jstride +
                              (long)((int)(lVar15 % lVar13) +
                                    (local_6c8.smallend.vect[0] - local_70.begin.x)) +
                              ((int)((long)uVar31 / lVar33) +
                              (local_6c8.smallend.vect[2] - local_70.begin.z)) * local_70.kstride].
                             flag & 3) == 1);
            piVar8[uVar31] = uVar19;
            uVar19 = uVar19 + uVar18;
            *(uint *)(local_508._0_8_ + uVar31 * 4) = uVar18;
            uVar31 = uVar31 + 1;
            uVar18 = uVar19;
          } while ((uVar29 & 0x7fffffff) != uVar31);
          if (uVar19 != 0) {
            local_528 = (undefined1  [16])0x0;
            local_518 = 0;
            sVar23 = 1;
            if (uVar19 != 1) {
              do {
                sVar23 = sVar23 * 3 + 1 >> 1;
              } while (sVar23 < uVar19);
            }
            local_620 = uVar19;
            PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>::
            AllocateBuffer((PODVector<amrex::GpuArray<double,_6U>,_std::allocator<amrex::GpuArray<double,_6U>_>_>
                            *)local_528,sVar23);
            uVar7 = local_528._0_8_;
            local_528._8_4_ = uVar19;
            local_528._12_4_ = 0;
            MultiCutFab::const_array(&local_268,local_680,&local_228);
            MultiCutFab::const_array(&local_b0,local_358,&local_228);
            MultiCutFab::const_array(&local_f0,local_350,&local_228);
            pMVar25 = local_348;
            MultiCutFab::const_array(&local_130,local_348,&local_228);
            iVar6 = local_614.bigend.vect[1];
            iVar47 = local_614.bigend.vect[0];
            iVar46 = local_614.smallend.vect[1];
            iVar12 = local_614.smallend.vect[0];
            if (local_6c8.smallend.vect[2] <= local_6c8.bigend.vect[2]) {
              local_538 = (double)local_268.jstride;
              local_468 = (double)(long)local_268.begin.y;
              local_648 = (double *)(long)local_268.begin.z;
              local_650 = local_b0.p;
              local_478 = (double)local_b0.jstride;
              local_630 = (double)(ulong)(uint)local_6c8.bigend.vect[0];
              local_658 = (ulong)(uint)local_6c8.bigend.vect[1];
              iVar26 = (local_6c8.bigend.vect[0] - local_6c8.smallend.vect[0]) + 1;
              local_498 = (double)CONCAT44(local_498._4_4_,iVar26);
              local_698 = (double)local_268.nstride;
              local_5b8 = (double)(local_268.nstride * 0x10);
              local_4a8._0_8_ = (long)local_b0.begin.y;
              local_660 = (long)local_b0.begin.z;
              local_668 = local_f0.p;
              local_638 = (double *)local_f0.jstride;
              local_670 = local_f0.kstride;
              local_678 = (long)local_f0.begin.z;
              local_640 = local_130.jstride;
              local_3a0 = local_130.kstride;
              local_4b8 = (double)(long)local_130.begin.y;
              local_618 = local_130.begin.z;
              local_5c8 = (double)(long)local_f0.begin.x;
              local_598 = (double)(long)local_268.begin.x;
              local_4c8 = local_6c8.bigend.vect[1] + 1;
              iVar28 = local_6c8.smallend.vect[2];
              do {
                dVar49 = (double)(ulong)(uint)local_6c8.smallend.vect[1];
                if (local_6c8.smallend.vect[1] <= local_6c8.bigend.vect[1]) {
                  uVar29 = (iVar28 - local_6c8.smallend.vect[2]) *
                           ((local_6c8.bigend.vect[1] - local_6c8.smallend.vect[1]) + 1) -
                           local_6c8.smallend.vect[1];
                  local_6a8 = (double)(ulong)uVar29;
                  lVar13 = (long)iVar28;
                  local_5e8 = local_268.p + (lVar13 - (long)local_648) * local_268.kstride;
                  local_458 = local_b0.p + (lVar13 - local_660) * local_b0.kstride;
                  lVar13 = (lVar13 - local_678) * local_f0.kstride;
                  do {
                    iVar14 = SUB84(dVar49,0);
                    if (local_6c8.bigend.vect[0] < local_6c8.smallend.vect[0]) {
                      dVar49 = (double)(ulong)(iVar14 + 1);
                    }
                    else {
                      lVar33 = (long)iVar14;
                      lVar15 = (lVar33 - (long)local_468) * local_268.jstride;
                      lVar17 = (lVar33 - local_b0.begin.y) * local_b0.jstride;
                      dVar49 = (double)(ulong)(iVar14 + 1U);
                      lVar16 = (lVar33 - (long)local_4b8) * local_130.jstride;
                      lVar33 = (long)local_6c8.smallend.vect[0];
                      do {
                        iVar22 = (int)lVar33;
                        iVar21 = (iVar22 - local_6c8.smallend.vect[0]) + (uVar29 + iVar14) * iVar26;
                        if (piVar8[iVar21] != 0) {
                          iVar21 = *(int *)(uVar57 + (long)iVar21 * 4);
                          lVar24 = lVar33 - (long)local_598;
                          ((pointer)(uVar7 + (long)iVar21 * 0x30))->arr[0] =
                               ((double)iVar22 + local_5e8[lVar15 + lVar24] + 0.5) * local_588;
                          ((pointer)(uVar7 + (long)iVar21 * 0x30))->arr[1] =
                               (local_5e8[lVar15 + lVar24 + local_268.nstride] + (double)iVar14 +
                               0.5) * local_448;
                          ((pointer)(uVar7 + (long)iVar21 * 0x30))->arr[2] =
                               (local_5e8[lVar15 + lVar24 + local_268.nstride * 2] + (double)iVar28
                               + 0.5) * local_5a8;
                          dVar51 = local_f0.p
                                   [lVar13 + (iVar14 - local_f0.begin.y) * local_f0.jstride +
                                             (lVar33 - (long)local_5c8)];
                          dVar41 = local_f0.p
                                   [lVar13 + (int)((iVar14 + 1U) - local_f0.begin.y) *
                                             local_f0.jstride + (lVar33 - (long)local_5c8)];
                          dVar35 = local_130.p
                                   [lVar16 + (lVar33 - local_130.begin.x) +
                                             (iVar28 - local_130.begin.z) * local_130.kstride];
                          dVar40 = local_130.p
                                   [lVar16 + (lVar33 - local_130.begin.x) +
                                             ((iVar28 + 1) - local_130.begin.z) * local_130.kstride]
                          ;
                          dVar37 = local_458[lVar17 + (lVar33 - local_b0.begin.x)] -
                                   local_458[lVar17 + ((iVar22 + 1) - local_b0.begin.x)];
                          dVar42 = dVar51 - dVar41;
                          dVar36 = dVar35 - dVar40;
                          dVar42 = 1.0 / SQRT(dVar36 * dVar36 + dVar37 * dVar37 + dVar42 * dVar42);
                          ((pointer)(uVar7 + (long)iVar21 * 0x30))->arr[3] =
                               dVar42 * -(local_458[lVar17 + ((iVar22 + 1) - local_b0.begin.x)] -
                                         local_458[lVar17 + (lVar33 - local_b0.begin.x)]);
                          (((pointer)(uVar7 + (long)iVar21 * 0x30))->arr + 3)[1] =
                               dVar42 * -(dVar41 - dVar51);
                          ((pointer)(uVar7 + (long)iVar21 * 0x30))->arr[5] =
                               -(dVar40 - dVar35) * dVar42;
                        }
                        lVar33 = lVar33 + 1;
                        local_5d8 = dVar49;
                      } while (iVar22 + 1 != local_6c8.bigend.vect[0] + 1U);
                    }
                  } while (SUB84(dVar49,0) != local_4c8);
                }
                pMVar25 = (MultiCutFab *)(ulong)(uint)local_6c8.smallend.vect[1];
                iVar28 = iVar28 + 1;
              } while (iVar28 != local_6c8.bigend.vect[2] + 1);
            }
            local_1c8.period.vect._0_8_ = local_588;
            local_1c8.period.vect[2] = SUB84(dStack_580,0);
            uStack_1bc = (undefined4)((ulong)dStack_580 >> 0x20);
            local_1b8 = local_5a8;
            local_1b0 = local_488;
            RStack_1a8 = RStack_480;
            local_1a0 = local_568;
            local_198 = local_620;
            local_190 = (pointer)uVar7;
            local_180 = local_340[3];
            local_168 = local_398.kstride;
            LStack_160 = local_398.nstride;
            local_178 = local_398.p;
            pdStack_170 = (double *)local_398.jstride;
            local_660 = CONCAT44(local_660._4_4_,local_614.bigend.vect[2]);
            local_188 = dVar48;
            local_138 = uVar34;
            if (local_614.smallend.vect[2] <= local_614.bigend.vect[2]) {
              local_668 = local_398.p;
              local_650 = (double *)local_398.jstride;
              lVar13 = (long)local_398.begin.x;
              local_658 = (ulong)local_398.begin.y;
              local_670 = (long)local_398.begin.z;
              local_678 = local_398.kstride;
              local_638 = (double *)uVar7 + 2;
              iVar28 = local_614.smallend.vect[2];
              do {
                if (iVar46 <= iVar6) {
                  dVar49 = (double)iVar28 * local_568;
                  local_648 = local_668 + (iVar28 - local_670) * local_678;
                  iVar26 = iVar46;
                  do {
                    pdVar5 = local_648;
                    if (iVar12 <= iVar47) {
                      dVar51 = (double)iVar26 * local_2d8;
                      lVar33 = ((long)iVar26 - local_658) * (long)local_650;
                      iVar14 = iVar12;
                      do {
                        local_598 = (double)iVar14 * local_488;
                        uVar32 = 0;
                        uVar31 = 0;
                        local_630 = 1.79769313486232e+308;
                        pdVar44 = local_638;
                        do {
                          dVar41 = local_598 - ((GpuArray<double,_6U> *)(pdVar44 + -2))->arr[0];
                          dVar41 = (dVar49 - *pdVar44) * (dVar49 - *pdVar44) +
                                   dVar41 * dVar41 + (dVar51 - pdVar44[-1]) * (dVar51 - pdVar44[-1])
                          ;
                          if (dVar41 < local_630) {
                            uVar31 = uVar32 & 0xffffffff;
                            local_630 = dVar41;
                          }
                          uVar32 = uVar32 + 1;
                          pdVar44 = pdVar44 + 6;
                        } while (uVar19 != uVar32);
                        iVar22 = (int)uVar31;
                        local_5c8 = ((pointer)(uVar7 + (long)iVar22 * 0x30))->arr[2];
                        uStack_5c0 = 0;
                        local_5b8 = ((pointer)(uVar7 + (long)iVar22 * 0x30))->arr[3];
                        local_5e8 = (double *)(((pointer)(uVar7 + (long)iVar22 * 0x30))->arr + 3)[1]
                        ;
                        local_538 = ((pointer)(uVar7 + (long)iVar22 * 0x30))->arr[5];
                        local_478 = -local_538;
                        dStack_470 = -local_5b8;
                        local_498 = ((pointer)(uVar7 + (long)iVar22 * 0x30))->arr[0];
                        dStack_490 = ((pointer)(uVar7 + (long)iVar22 * 0x30))->arr[1];
                        local_4a8._8_8_ = dStack_490;
                        local_4a8._0_8_ = dStack_490;
                        dVar41 = (dVar49 - local_5c8) * local_478 +
                                 ((local_598 - local_498) * dStack_470 -
                                 (dVar51 - dStack_490) * (double)local_5e8);
                        uStack_530 = 0;
                        local_698 = local_538 * dVar41 + dVar49;
                        uStack_690 = 0;
                        dVar40 = (double)local_438._8_8_ * dStack_490;
                        uStack_590 = 0;
                        uStack_5e0 = local_5e8;
                        pdStack_5b0 = local_5e8;
                        local_468 = local_538;
                        dStack_460 = local_5b8;
                        dVar35 = floor((double)local_438._0_8_ * local_498);
                        dVar40 = floor(dVar40);
                        local_5d8 = (double)CONCAT44((int)dVar40,(int)dVar35);
                        dStack_5d0 = 0.0;
                        dVar35 = floor(local_628 * local_5c8);
                        iVar30 = (int)dVar35;
                        dVar42 = dVar41 * local_5b8 + local_598;
                        pdVar44 = (double *)(dVar41 * (double)pdStack_5b0 + dVar51);
                        local_6a8 = (double)local_438._0_8_ * dVar42;
                        dStack_6a0 = (double)local_438._8_8_ * (double)pdVar44;
                        dVar35 = floor(local_6a8);
                        dVar40 = floor(dStack_6a0);
                        local_6a8 = (double)CONCAT44((int)dVar40,(int)dVar35);
                        dStack_6a0 = 0.0;
                        dVar35 = floor(local_628 * local_698);
                        iVar22 = (uint)local_5d8;
                        iVar21 = local_5d8._4_4_;
                        auVar39._0_4_ = -(uint)((uint)local_5d8 == (int)local_6a8);
                        auVar39._4_4_ = auVar39._0_4_;
                        auVar39._8_4_ = -(uint)(local_5d8._4_4_ == local_6a8._4_4_);
                        auVar39._12_4_ = -(uint)(local_5d8._4_4_ == local_6a8._4_4_);
                        iVar10 = movmskpd(extraout_EAX,auVar39);
                        dVar41 = ABS(dVar41);
                        if ((iVar30 == (int)dVar35 && iVar10 == 3) || (local_2c8 < dVar41)) {
                          uVar31 = CONCAT44(uStack_5f4,local_5f8);
                        }
                        else {
                          uStack_4c4 = local_5e8._4_4_ ^ 0x80000000;
                          uStack_4ac = uStack_5e0._4_4_ ^ 0x80000000;
                          uStack_4b0 = (undefined4)uStack_5e0;
                          local_4c8 = (int)local_5e8;
                          uStack_4bc = local_5b8._4_4_;
                          local_4b8 = -(double)CONCAT44(local_5e8._4_4_,pdStack_5b0._0_4_);
                          iVar10 = -1;
                          local_458 = pdVar44;
                          uStack_450 = pdVar44;
                          do {
                            local_640 = CONCAT44(local_640._4_4_,iVar10);
                            dVar40 = floor(((double)iVar10 * 1e-06 * local_5a8 + local_698) *
                                           local_628);
                            iVar10 = -1;
                            do {
                              dVar36 = floor(((double)iVar10 * 1e-06 * local_448 + (double)local_458
                                             ) * local_2b8);
                              iVar20 = -1;
                              do {
                                dVar37 = floor(((double)iVar20 * 1e-06 * local_588 + dVar42) *
                                               (double)local_438._0_8_);
                                if (((iVar22 == (int)dVar37) && (iVar21 == (int)dVar36)) &&
                                   (iVar30 == (int)dVar40)) {
                                  uVar31 = CONCAT44(uStack_5f4,local_5f8);
                                  goto LAB_005ea50f;
                                }
                                iVar20 = iVar20 + 1;
                              } while (iVar20 != 2);
                              iVar10 = iVar10 + 1;
                            } while (iVar10 != 2);
                            iVar10 = (int)local_640 + 1;
                          } while (iVar10 != 2);
                          local_550 = local_6a8;
                          local_548 = (int)dVar35;
                          local_560[0] = (uint)local_5d8;
                          local_560[1] = local_5d8._4_4_;
                          local_560[2] = iVar30;
                          local_340[0] = local_598;
                          local_340[1] = dVar51;
                          local_340[2] = dVar49;
                          local_544[0] = 0;
                          local_544[1] = 0;
                          local_544[2] = 0;
                          lVar15 = 0;
                          uVar29 = 0;
                          do {
                            if (*(uint *)((long)&local_550 + lVar15 * 4) != local_560[lVar15]) {
                              lVar17 = (long)(int)uVar29;
                              uVar29 = uVar29 + 1;
                              local_544[lVar17] = (int)lVar15;
                            }
                            lVar15 = lVar15 + 1;
                          } while (lVar15 != 3);
                          if ((int)uVar29 < 1) {
                            dVar41 = 0.0;
                            local_698 = 0.0;
                            local_788 = 0.0;
                          }
                          else {
                            local_5c8 = local_5c8 * local_538 +
                                        local_498 * local_5b8 +
                                        (double)local_4a8._0_8_ * (double)local_5e8;
                            dVar40 = (double)(int)(uint)local_5d8;
                            local_6a8 = -(double)(iVar22 + 1) * (double)local_318._0_8_;
                            dStack_6a0 = -dVar40 * (double)local_318._8_8_;
                            dVar42 = (double)local_5d8._4_4_;
                            local_5e8 = (double *)(-(double)(iVar30 + 1) * local_308);
                            uStack_5e0 = (double *)(-(double)iVar30 * dStack_300);
                            uStack_5c0 = 0x3ff0000000000000;
                            dVar41 = 0.0;
                            local_788 = 0.0;
                            local_5d8 = -(double)(iVar21 + 1) * local_448;
                            dStack_5d0 = -dVar42 * dStack_440;
                            uVar31 = 0;
                            dVar35 = 1.79769313486232e+308;
                            local_698 = 0.0;
                            do {
                              lVar15 = (long)local_544[uVar31];
                              local_3c8[0] = 0.0;
                              local_3c8[1] = 0.0;
                              local_3c8[2] = 0.0;
                              local_3c8[lVar15] = 1.0;
                              dVar50 = local_3c8[2];
                              dVar37 = local_3c8[1];
                              dVar36 = local_3c8[0];
                              if (((ABS(local_5b8) != ABS(local_3c8[0])) ||
                                  (NAN(ABS(local_5b8)) || NAN(ABS(local_3c8[0])))) ||
                                 (auVar45._8_8_ =
                                       -(ulong)(ABS(local_3c8[1]) == ABS((double)pdStack_5b0)),
                                 auVar45._0_8_ = -(ulong)(ABS(local_3c8[2]) == ABS(local_538)),
                                 iVar22 = movmskpd((int)pMVar25,auVar45), iVar22 != 3)) {
                                uVar18 = local_560[lVar15];
                                local_3e8[0] = (dVar40 + 0.5) * local_588;
                                local_3e8[1] = (dVar42 + 0.5) * dStack_580;
                                local_3e8[2] = ((double)iVar30 + 0.5) * local_5a8;
                                local_3e8[lVar15] =
                                     (double)(int)(((int)uVar18 <
                                                   *(int *)((long)&local_550 + lVar15 * 4)) + uVar18
                                                  ) *
                                     *(double *)(local_1c8.period.vect + lVar15 * 2);
                                dVar52 = local_3e8[2] * dVar50 +
                                         local_3e8[0] * dVar36 + local_3e8[1] * dVar37;
                                dVar56 = local_538 * dVar50 +
                                         (double)CONCAT44(uStack_4bc,uStack_4c0) * dVar36 +
                                         (double)pdStack_5b0 * dVar37;
                                dVar63 = 1.0 - dVar56 * dVar56;
                                dVar62 = (local_5c8 - dVar52 * dVar56) / dVar63;
                                dVar63 = (dVar56 * -local_5c8 + dVar52) / dVar63;
                                local_288[2] = dVar62 * local_538 + dVar50 * dVar63;
                                local_288[0] = dVar62 * local_5b8 + dVar63 * dVar36;
                                local_288[1] = dVar62 * (double)pdStack_5b0 + dVar63 * dVar37;
                                local_2a8[2] = dVar37 * local_5b8 + dVar36 * local_4b8;
                                local_2a8[0] = dVar50 * (double)pdStack_5b0 + dVar37 * local_478;
                                local_2a8[1] = local_468 * dVar36 + dVar50 * dStack_470;
                                dVar36 = -((local_288[2] - dVar49) * local_2a8[2] +
                                          (local_288[0] - local_598) * local_2a8[0] +
                                          (local_288[1] - dVar51) * local_2a8[1]) /
                                         (local_2a8[2] * local_2a8[2] +
                                         local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1]);
                                local_408[0] = dVar36 * local_2a8[0] + local_288[0];
                                local_408[1] = dVar36 * local_2a8[1] + local_288[1];
                                local_408[2] = dVar36 * local_2a8[2] + local_288[2];
                                auVar59 = _DAT_0075ad80;
                                if ((2.220446049250313e-16 < ABS(local_2a8[0])) &&
                                   (auVar53._8_8_ = local_2a8[0], auVar53._0_8_ = local_2a8[0],
                                   auVar58._8_8_ = -(local_288[0] + dStack_6a0),
                                   auVar58._0_8_ = -(local_288[0] + local_6a8),
                                   auVar59 = divpd(auVar58,auVar53), 0.0 <= local_2a8[0])) {
                                  uVar57 = auVar59._8_8_;
                                  auVar59._8_8_ = auVar59._0_8_;
                                  auVar59._0_8_ = uVar57;
                                }
                                auVar61 = _DAT_0075ad80;
                                if ((2.220446049250313e-16 < ABS(local_2a8[1])) &&
                                   (auVar60._8_8_ = -(local_288[1] + dStack_5d0),
                                   auVar60._0_8_ = -(local_288[1] + local_5d8),
                                   auVar2._8_8_ = local_2a8[1], auVar2._0_8_ = local_2a8[1],
                                   auVar61 = divpd(auVar60,auVar2), 0.0 <= local_2a8[1])) {
                                  uVar57 = auVar61._8_8_;
                                  auVar61._8_8_ = auVar61._0_8_;
                                  auVar61._0_8_ = uVar57;
                                }
                                auVar55 = _DAT_0075ad80;
                                if ((2.220446049250313e-16 < ABS(local_2a8[2])) &&
                                   (auVar54._8_8_ = -(local_288[2] + (double)uStack_5e0),
                                   auVar54._0_8_ = -(local_288[2] + (double)local_5e8),
                                   auVar3._8_8_ = local_2a8[2], auVar3._0_8_ = local_2a8[2],
                                   auVar55 = divpd(auVar54,auVar3), 0.0 <= local_2a8[2])) {
                                  uVar57 = auVar55._8_8_;
                                  auVar55._8_8_ = auVar55._0_8_;
                                  auVar55._0_8_ = uVar57;
                                }
                                dVar37 = auVar61._0_8_;
                                if (auVar61._0_8_ <= auVar59._0_8_) {
                                  dVar37 = auVar59._0_8_;
                                }
                                dVar50 = auVar55._0_8_;
                                if (auVar55._0_8_ <= dVar37) {
                                  dVar50 = dVar37;
                                }
                                if (dVar50 <= dVar36) {
                                  dVar37 = auVar61._8_8_;
                                  if (auVar59._8_8_ <= auVar61._8_8_) {
                                    dVar37 = auVar59._8_8_;
                                  }
                                  dVar52 = auVar55._8_8_;
                                  if (dVar37 <= auVar55._8_8_) {
                                    dVar52 = dVar37;
                                  }
                                  dVar50 = dVar36;
                                  if (dVar52 < dVar36) {
                                    dVar50 = dVar52;
                                  }
                                }
                                local_428[0] = 0.0;
                                local_428[1] = 0.0;
                                local_428[2] = 0.0;
                                lVar15 = 0;
                                do {
                                  dVar36 = local_2a8[lVar15] * dVar50 + local_288[lVar15];
                                  local_408[lVar15] = dVar36;
                                  local_428[lVar15] = dVar36 - local_340[lVar15];
                                  lVar15 = lVar15 + 1;
                                } while (lVar15 != 3);
                                dVar36 = local_428[2] * local_428[2] +
                                         local_428[0] * local_428[0] + local_428[1] * local_428[1];
                                if (dVar36 < dVar35) {
                                  local_788 = local_408[0];
                                  local_698 = local_408[1];
                                  dVar35 = dVar36;
                                  dVar41 = local_408[2];
                                }
                              }
                              else {
                                uVar18 = 3;
                              }
                              pMVar25 = (MultiCutFab *)(ulong)uVar18;
                              uVar31 = uVar31 + 1;
                            } while (uVar31 != uVar29);
                          }
                          dVar41 = (dVar41 - dVar49) * (dVar41 - dVar49) +
                                   (local_788 - local_598) * (local_788 - local_598) +
                                   (local_698 - dVar51) * (local_698 - dVar51);
                          if (local_630 <= dVar41) {
                            dVar41 = local_630;
                          }
                          if (dVar41 < 0.0) {
                            dVar41 = sqrt(dVar41);
                          }
                          else {
                            dVar41 = SQRT(dVar41);
                          }
                          uVar31 = CONCAT44(uStack_5f4,local_5f8);
                          dVar41 = ABS(dVar41);
                        }
LAB_005ea50f:
                        uVar32 = -(ulong)(0.0 < pdVar5[lVar33 + (iVar14 - lVar13)]);
                        if (dVar48 <= dVar41) {
                          dVar41 = dVar48;
                        }
                        pdVar5[lVar33 + (iVar14 - lVar13)] =
                             dVar41 * (double)(~uVar32 & uVar34 | uVar32 & uVar31);
                        bVar9 = iVar14 != iVar47;
                        iVar14 = iVar14 + 1;
                      } while (bVar9);
                    }
                    bVar9 = iVar26 != iVar6;
                    iVar26 = iVar26 + 1;
                  } while (bVar9);
                }
                bVar9 = iVar28 != (int)local_660;
                iVar28 = iVar28 + 1;
              } while (bVar9);
            }
            Gpu::Device::streamSynchronize();
            if ((pointer)local_528._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_528._0_8_,local_518 * 0x30);
            }
            piVar27 = (pointer)local_508._0_8_;
            goto LAB_005e959a;
          }
LAB_005e959f:
          operator_delete(piVar27,local_4f8 << 2);
        }
        if (local_4e8.m_data != (pointer)0x0) {
          operator_delete(local_4e8.m_data,local_4e8.m_capacity << 2);
        }
      }
      else if (local_614.smallend.vect[2] <= local_614.bigend.vect[2]) {
        uVar29 = local_614.bigend.vect[0] - local_614.smallend.vect[0];
        auVar38._4_4_ = 0;
        auVar38._0_4_ = uVar29;
        auVar38._8_4_ = uVar29;
        auVar38._12_4_ = 0;
        iVar12 = local_614.smallend.vect[2];
        do {
          if (local_614.smallend.vect[1] <= local_614.bigend.vect[1]) {
            lVar33 = (long)local_398.p +
                     ((long)iVar12 - (long)local_398.begin.z) * local_398.kstride * 8 +
                     (long)local_614.smallend.vect[0] * 8 +
                     ((long)local_614.smallend.vect[1] - (long)local_398.begin.y) *
                     local_398.jstride * 8 + (long)local_398.begin.x * -8 + 8;
            lVar13 = (long)local_614.smallend.vect[1];
            do {
              if (local_614.smallend.vect[0] <= local_614.bigend.vect[0]) {
                uVar31 = 0;
                do {
                  auVar43._8_4_ = (int)uVar31;
                  auVar43._0_8_ = uVar31;
                  auVar43._12_4_ = (int)(uVar31 >> 0x20);
                  auVar45 = auVar38 ^ auVar39;
                  auVar43 = (auVar43 | auVar4) ^ auVar39;
                  bVar9 = auVar45._0_4_ < auVar43._0_4_;
                  iVar46 = auVar45._4_4_;
                  iVar47 = auVar43._4_4_;
                  if ((bool)(~(iVar46 < iVar47 || iVar47 == iVar46 && bVar9) & 1)) {
                    uVar32 = -(ulong)(0.0 < *(double *)(lVar33 + -8 + uVar31 * 8));
                    *(double *)(lVar33 + -8 + uVar31 * 8) =
                         (double)(~uVar32 & uVar34 | uVar32 & CONCAT44(uStack_5f4,local_5f8)) *
                         dVar48;
                  }
                  if (iVar46 >= iVar47 && (iVar47 != iVar46 || !bVar9)) {
                    uVar32 = -(ulong)(0.0 < *(double *)(lVar33 + uVar31 * 8));
                    *(double *)(lVar33 + uVar31 * 8) =
                         (double)(~uVar32 & uVar34 | uVar32 & CONCAT44(uStack_5f4,local_5f8)) *
                         dVar48;
                  }
                  uVar31 = uVar31 + 2;
                } while (((ulong)uVar29 + 2 & 0xfffffffffffffffe) != uVar31);
              }
              lVar13 = lVar13 + 1;
              lVar33 = lVar33 + local_398.jstride * 8;
            } while (local_614.bigend.vect[1] + 1 != (int)lVar13);
          }
          bVar9 = iVar12 != local_614.bigend.vect[2];
          iVar12 = iVar12 + 1;
        } while (bVar9);
      }
      MFIter::operator++(&local_228);
    } while (local_228.currentIndex < local_228.endIndex);
  }
  MFIter::~MFIter(&local_228);
  PVar64 = Geometry::periodicity(&local_3a8->m_geom);
  local_1c8.period.vect._0_8_ = PVar64.period.vect._0_8_;
  local_1c8.period.vect[2] = PVar64.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&mf->super_FabArray<amrex::FArrayBox>,0,1,&local_1c8,false);
  return;
}

Assistant:

void FillSignedDistance (MultiFab& mf, EB2::Level const& ls_lev,
                         EBFArrayBoxFactory const& eb_factory, int refratio,
                         bool fluid_has_positive_sign)
{
    AMREX_ALWAYS_ASSERT(mf.is_nodal());

    ls_lev.fillLevelSet(mf, ls_lev.Geom()); // This is the implicit function, not the SDF.

    const auto& bndrycent = eb_factory.getBndryCent();
    const auto& areafrac = eb_factory.getAreaFrac();
    const auto& flags = eb_factory.getMultiEBCellFlagFab();
    const int eb_pad = bndrycent.nGrow();

    const auto dx_ls = ls_lev.Geom().CellSizeArray();
    const auto dx_eb = eb_factory.Geom().CellSizeArray();
    Real dx_eb_max = amrex::max(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2]));
    Real ls_roof = amrex::min(AMREX_D_DECL(dx_eb[0],dx_eb[1],dx_eb[2])) * (flags.nGrow()+1);

    Real fluid_sign = fluid_has_positive_sign ? 1._rt : -1._rt;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        Box const& gbx = mfi.fabbox();
        Array4<Real> const& fab = mf.array(mfi);

        if (bndrycent.ok(mfi))
        {
            const auto& flag = flags.const_array(mfi);

            Box eb_search = mfi.validbox();
            eb_search.coarsen(refratio).enclosedCells().grow(eb_pad);

            const int nallcells = eb_search.numPts();

            Gpu::DeviceVector<int> is_cut(nallcells);
            int* p_is_cut = is_cut.data();

            Gpu::DeviceVector<int> cutcell_offset(nallcells);
            int* p_cutcell_offset = cutcell_offset.data();

            int ncutcells = Scan::PrefixSum<int>
                (nallcells,
                 [=] AMREX_GPU_DEVICE (int icell) -> int
                 {
                     GpuArray<int,3> ijk = eb_search.atOffset3d(icell);
                     int is_cut_cell = flag(ijk[0],ijk[1],ijk[2]).isSingleValued();
                     p_is_cut[icell] = is_cut_cell;
                     return is_cut_cell;
                 },
                 [=] AMREX_GPU_DEVICE (int icell, int const& x)
                 {
                     p_cutcell_offset[icell] = x;
                 },
                 Scan::Type::exclusive, Scan::retSum);

            if (ncutcells > 0) {
                Gpu::DeviceVector<GpuArray<Real,AMREX_SPACEDIM*2> > facets(ncutcells);
                auto p_facets = facets.data();
                Array4<Real const> const& bcent = bndrycent.const_array(mfi);
                AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                             Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                             Array4<Real const> const& apz = areafrac[2]->const_array(mfi));
                amrex::ParallelFor(eb_search, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int icell = eb_search.index(IntVect(AMREX_D_DECL(i,j,k)));
                    if (p_is_cut[icell]) {
                        GpuArray<Real,AMREX_SPACEDIM*2>& fac = p_facets[p_cutcell_offset[icell]];
                        AMREX_D_TERM(fac[0] = (bcent(i,j,k,0)+Real(i)+0.5_rt) * dx_eb[0];,
                                     fac[1] = (bcent(i,j,k,1)+Real(j)+0.5_rt) * dx_eb[1];,
                                     fac[2] = (bcent(i,j,k,2)+Real(k)+0.5_rt) * dx_eb[2]);

                         Real axm = apx(i,  j  , k  );
                         Real axp = apx(i+1,j  , k  );
                         Real aym = apy(i,  j  , k  );
                         Real ayp = apy(i,  j+1, k  );
#if (AMREX_SPACEDIM == 3)
                         Real azm = apz(i,  j  , k  );
                         Real azp = apz(i,  j  , k+1);
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp) +
                                                 (azm-azp)*(azm-azp));
#else
                         Real apnorm = std::sqrt((axm-axp)*(axm-axp) +
                                                 (aym-ayp)*(aym-ayp));
#endif
                         Real apnorminv = 1._rt / apnorm;
                         AMREX_D_TERM(Real anrmx = (axp-axm) * apnorminv;,   // pointing to the wall
                                      Real anrmy = (ayp-aym) * apnorminv;,
                                      Real anrmz = (azp-azm) * apnorminv);

                         // pointing to the fluid
                         AMREX_D_TERM(fac[AMREX_SPACEDIM+0] = -anrmx;,
                                      fac[AMREX_SPACEDIM+1] = -anrmy;,
                                      fac[AMREX_SPACEDIM+2] = -anrmz);
                    }
                });

                amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    AMREX_D_TERM(Real dxinv = 1._rt/dx_eb[0];,
                                 Real dyinv = 1._rt/dx_eb[1];,
                                 Real dzinv = 1._rt/dx_eb[2]);
                    AMREX_D_TERM(Real x = i*dx_ls[0];,
                                 Real y = j*dx_ls[1];,
                                 Real z = k*dx_ls[2]);
                    Real min_dist2 = std::numeric_limits<Real>::max();
                    int i_nearest = 0;
                    for (int ifac  = 0; ifac < ncutcells; ++ifac) {
                        AMREX_D_TERM(Real cx = p_facets[ifac][0];,
                                     Real cy = p_facets[ifac][1];,
                                     Real cz = p_facets[ifac][2]);
                        Real dist2 = AMREX_D_TERM((x-cx)*(x-cx),+(y-cy)*(y-cy),+(z-cz)*(z-cz));
                        if (dist2 < min_dist2) {
                            i_nearest = ifac;
                            min_dist2 = dist2;
                        }
                    }

                    // Test if pos "projects onto" the nearest EB facet's interior
                    AMREX_D_TERM(Real cx = p_facets[i_nearest][0];,
                                 Real cy = p_facets[i_nearest][1];,
                                 Real cz = p_facets[i_nearest][2]);
                    AMREX_D_TERM(Real nx = p_facets[i_nearest][AMREX_SPACEDIM+0];,
                                 Real ny = p_facets[i_nearest][AMREX_SPACEDIM+1];,
                                 Real nz = p_facets[i_nearest][AMREX_SPACEDIM+2]);
                    Real dist_proj = AMREX_D_TERM((x-cx)*(-nx),+(y-cy)*(-ny),+(z-cz)*(-nz));
                    AMREX_D_TERM(Real eb_min_x = x + nx*dist_proj;,
                                 Real eb_min_y = y + ny*dist_proj;,
                                 Real eb_min_z = z + nz*dist_proj);
                    AMREX_D_TERM(int vi_cx = static_cast<int>(amrex::Math::floor(cx * dxinv));,
                                 int vi_cy = static_cast<int>(amrex::Math::floor(cy * dyinv));,
                                 int vi_cz = static_cast<int>(amrex::Math::floor(cz * dzinv)));
                    AMREX_D_TERM(int vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                 int vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                 int vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));

                    bool min_pt_valid = false;
                    if ((AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z))  ||
                        amrex::Math::abs(dist_proj) > ls_roof + dx_eb_max)
                    {
                        // If the distance is very big, we can set it to true as well.
                        // Later the signed distance will be assigned the roof value.
                        min_pt_valid = true;
                    } else { // rounding error might give false negatives
#if (AMREX_SPACEDIM == 3)
                        for (int k_shift = -1; k_shift <= 1; ++k_shift) {
#endif
                        for (int j_shift = -1; j_shift <= 1; ++j_shift) {
                        for (int i_shift = -1; i_shift <= 1; ++i_shift) {
                            AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor((eb_min_x+i_shift*1.e-6_rt*dx_eb[0])*dxinv));,
                                         vi_y = static_cast<int>(amrex::Math::floor((eb_min_y+j_shift*1.e-6_rt*dx_eb[1])*dyinv));,
                                         vi_z = static_cast<int>(amrex::Math::floor((eb_min_z+k_shift*1.e-6_rt*dx_eb[2])*dzinv)));
                            if (AMREX_D_TERM(vi_cx == vi_x, && vi_cy == vi_y, && vi_cz == vi_z)) {
                                min_pt_valid = true;
                                goto after_loops;
                            }
                        }}
#if (AMREX_SPACEDIM == 3)
                        }
#endif
                        after_loops:;
                    }

                    // If projects onto nearest EB facet, then return projected distance
                    // Alternatively: find the nearest point on the EB edge
                    Real min_dist;
                    if ( min_pt_valid ) {
                        // this is a signed distance function
                        min_dist = dist_proj;
                    } else {
                        // fallback: find the nearest point on the EB edge
                        // revert the value of vi_x, vi_y and vi_z
                        AMREX_D_TERM(vi_x = static_cast<int>(amrex::Math::floor(eb_min_x * dxinv));,
                                     vi_y = static_cast<int>(amrex::Math::floor(eb_min_y * dyinv));,
                                     vi_z = static_cast<int>(amrex::Math::floor(eb_min_z * dzinv)));
                        auto c_vec = detail::facets_nearest_pt
                            ({AMREX_D_DECL(vi_x,vi_y,vi_z)}, {AMREX_D_DECL(vi_cx, vi_cy, vi_cz)},
                             {AMREX_D_DECL(x,y,z)}, {AMREX_D_DECL(nx,ny,nz)},
                             {AMREX_D_DECL(cx,cy,cz)}, dx_eb);
                        Real min_edge_dist2 = AMREX_D_TERM( (c_vec[0]-x)*(c_vec[0]-x),
                                                           +(c_vec[1]-y)*(c_vec[1]-y),
                                                           +(c_vec[2]-z)*(c_vec[2]-z));
                        min_dist = -std::sqrt(amrex::min(min_dist2, min_edge_dist2));
                    }

                    Real usd = amrex::min(ls_roof,amrex::Math::abs(min_dist));
                    if (fab(i,j,k) <= 0._rt) {
                        fab(i,j,k) = fluid_sign * usd;
                    } else {
                        fab(i,j,k) = (-fluid_sign) * usd;
                    }
                });
                Gpu::streamSynchronize();
            }
        } else {
            amrex::ParallelFor(gbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (fab(i,j,k) <= 0._rt) {
                    fab(i,j,k) = fluid_sign * ls_roof;
                } else {
                    fab(i,j,k) = (-fluid_sign) * ls_roof;
                }
            });
        }
    }

    mf.FillBoundary(0,1,ls_lev.Geom().periodicity());
}

}